

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cxx
# Opt level: O1

ptr<snapshot> __thiscall nuraft::snapshot::deserialize(snapshot *this,buffer_serializer *bs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ptr<snapshot> pVar2;
  type snp_type;
  undefined1 local_59;
  ptr<cluster_config> conf;
  ulong size;
  ulong last_log_term;
  ulong last_log_idx;
  
  snp_type = buffer_serializer::get_u8(bs);
  last_log_idx = buffer_serializer::get_u64(bs);
  last_log_term = buffer_serializer::get_u64(bs);
  size = buffer_serializer::get_u64(bs);
  cluster_config::deserialize((cluster_config *)&conf,bs);
  this->last_log_idx_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::snapshot,std::allocator<nuraft::snapshot>,unsigned_long&,unsigned_long&,std::shared_ptr<nuraft::cluster_config>&,unsigned_long&,nuraft::snapshot::type&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->last_log_term_,(snapshot **)this,
             (allocator<nuraft::snapshot> *)&local_59,&last_log_idx,&last_log_term,
             (shared_ptr<nuraft::cluster_config> *)&conf,&size,&snp_type);
  _Var1._M_pi = extraout_RDX;
  if (conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  pVar2.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  pVar2.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<snapshot>)pVar2.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<snapshot> snapshot::deserialize(buffer_serializer& bs) {
    type snp_type = static_cast<type>(bs.get_u8());
    ulong last_log_idx = bs.get_u64();
    ulong last_log_term = bs.get_u64();
    ulong size = bs.get_u64();
    ptr<cluster_config> conf( cluster_config::deserialize(bs) );
    return cs_new<snapshot>(last_log_idx, last_log_term, conf, size, snp_type);
}